

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::MultiFileColumnMapper::CreateFilters
          (MultiFileColumnMapper *this,
          map<unsigned_long,_std::reference_wrapper<duckdb::TableFilter>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<duckdb::TableFilter>_>_>_>
          *filters,ResultColumnMapping *mapping)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Base_ptr global_filter;
  LogicalType *other;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var3;
  _Alloc_hider _Var4;
  type pBVar5;
  ClientContext *pCVar6;
  iterator iVar7;
  reference pvVar8;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
  *p_Var9;
  reference pvVar10;
  type expr;
  mapped_type *pmVar11;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var12;
  _Rb_tree_node_base *p_Var13;
  InternalException *this_00;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *in_RCX;
  idx_t local_id;
  idx_t filter_idx;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_88;
  size_type local_80;
  string local_78;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_58;
  vector<duckdb::ColumnIndex,_true> *local_50;
  _Rb_tree_node_base *local_48;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  idx_t local_38;
  
  if ((mapping->global_to_local)._M_h._M_rehash_policy._M_next_resize == 0) {
    this->context = (ClientContext *)0x0;
  }
  else {
    local_40 = in_RCX;
    pBVar5 = shared_ptr<duckdb::BaseFileReader,_true>::operator*
                       ((shared_ptr<duckdb::BaseFileReader,_true> *)
                        (filters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent);
    pCVar6 = (ClientContext *)operator_new(0x30);
    p_Var1 = &(pCVar6->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    (pCVar6->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (pCVar6->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pCVar6->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (pCVar6->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pCVar6->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1;
    *(__weak_count<(__gnu_cxx::_Lock_policy)2> **)&pCVar6->interrupted = p_Var1;
    (pCVar6->registered_state).
    super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
    .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> =
         (_Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>)0x0;
    this->context = pCVar6;
    p_Var13 = (_Rb_tree_node_base *)(mapping->global_to_local)._M_h._M_element_count;
    local_48 = (_Rb_tree_node_base *)&(mapping->global_to_local)._M_h._M_bucket_count;
    if (p_Var13 != local_48) {
      local_50 = &pBVar5->column_indexes;
      local_58 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&pBVar5->expression_map;
      do {
        global_filter = p_Var13[1]._M_parent;
        iVar7 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_std::allocator<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_40,(key_type *)(p_Var13 + 1));
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
            ._M_cur == (__node_type *)0x0) {
          this_00 = (InternalException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Error in \'EvaluateConstantFilters\', this filter should not end up in CreateFilters!"
                     ,"");
          InternalException::InternalException(this_00,&local_78);
          __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_80 = *(size_type *)
                    ((long)iVar7.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                           ._M_cur + 0x10);
        pvVar8 = vector<duckdb::ColumnIndex,_true>::operator[](local_50,local_80);
        local_38 = pvVar8->index;
        other = *(LogicalType **)
                 ((long)iVar7.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                        ._M_cur + 0x58);
        local_88._M_head_impl = (TableFilter *)0x0;
        if (*(int *)((long)iVar7.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                           ._M_cur + 0x60) == 0) {
          (**(code **)(*(long *)global_filter + 0x20))(&local_78,global_filter);
LAB_0123ca81:
          _Var4._M_p = local_78._M_dataplus._M_p;
          _Var3._M_head_impl = local_88._M_head_impl;
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_88._M_head_impl = (TableFilter *)_Var4._M_p;
          if ((_Var3._M_head_impl != (TableFilter *)0x0) &&
             ((*(_Var3._M_head_impl)->_vptr_TableFilter[1])(),
             (long *)local_78._M_dataplus._M_p != (long *)0x0)) {
            (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
          }
          if (local_88._M_head_impl == (TableFilter *)0x0) goto LAB_0123cadd;
          p_Var9 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                    *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                      ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                                    *)this);
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
          ::
          _M_emplace_unique<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    (p_Var9,&local_80,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_88);
        }
        else {
          if (*(int *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                             ._M_cur + 0x60) == 1) {
            TryCastTableFilter((duckdb *)&local_78,(TableFilter *)global_filter,
                               (MultiFileIndexMapping *)
                               ((long)iVar7.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                                      ._M_cur + 0x10),
                               *(LogicalType **)
                                ((long)iVar7.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::MultiFileColumnMap>,_false>
                                       ._M_cur + 0x50));
            goto LAB_0123ca81;
          }
LAB_0123cadd:
          p_Var9 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
                    *)unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                      ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                                    *)this);
          (**(code **)(*(long *)global_filter + 0x20))(&local_78,global_filter);
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>
          ::
          _M_emplace_unique<unsigned_long&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
                    (p_Var9,&local_80,
                     (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                      *)&local_78);
          if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_78._M_dataplus._M_p + 8))();
          }
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)&(filters->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent[2]._M_right,local_80);
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar10);
          SetIndexToZero(expr);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)&(filters->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent[2]._M_right,local_80);
          pmVar11 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_58,&local_38);
          _Var2._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          _Var12._M_head_impl =
               (pmVar11->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pmVar11->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var2._M_head_impl;
          if (_Var12._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var12._M_head_impl)->super_BaseExpression + 8))();
          }
          _Var12._M_head_impl = (Expression *)operator_new(0x60);
          LogicalType::LogicalType((LogicalType *)&local_78,other);
          BoundReferenceExpression::BoundReferenceExpression
                    ((BoundReferenceExpression *)_Var12._M_head_impl,(LogicalType *)&local_78,
                     local_80);
          LogicalType::~LogicalType((LogicalType *)&local_78);
          pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                  *)&(filters->_M_t)._M_impl.super__Rb_tree_header._M_header.
                                     _M_parent[2]._M_right,local_80);
          _Var2._M_head_impl =
               (pvVar10->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pvVar10->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var12._M_head_impl;
          if (_Var2._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
          }
        }
        if (local_88._M_head_impl != (TableFilter *)0x0) {
          (*(local_88._M_head_impl)->_vptr_TableFilter[1])();
        }
        p_Var13 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var13);
      } while (p_Var13 != local_48);
    }
  }
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)this;
}

Assistant:

unique_ptr<TableFilterSet> MultiFileColumnMapper::CreateFilters(map<idx_t, reference<TableFilter>> &filters,
                                                                ResultColumnMapping &mapping) {
	if (filters.empty()) {
		return nullptr;
	}
	auto &reader = *reader_data.reader;
	auto &global_to_local = mapping.global_to_local;
	auto result = make_uniq<TableFilterSet>();
	for (auto &it : filters) {
		auto &global_index = it.first;
		auto &global_filter = it.second.get();

		auto local_it = global_to_local.find(global_index);
		if (local_it == global_to_local.end()) {
			throw InternalException(
			    "Error in 'EvaluateConstantFilters', this filter should not end up in CreateFilters!");
		}
		auto &map_entry = local_it->second;
		auto local_id = map_entry.mapping.index;
		auto filter_idx = reader.column_indexes[local_id].GetPrimaryIndex();
		auto &local_type = map_entry.local_type;
		auto &global_type = map_entry.global_type;

		unique_ptr<TableFilter> local_filter;
		switch (map_entry.filter_conversion) {
		case FilterConversionType::COPY_DIRECTLY:
			// no conversion required - just copy the filter
			local_filter = global_filter.Copy();
			break;
		case FilterConversionType::CAST_FILTER:
			// types are different - try to convert
			local_filter = TryCastTableFilter(global_filter, map_entry.mapping, local_type);
			break;
		default:
			// we need to execute the filter globally
			break;
		}
		if (local_filter) {
			// succeeded in casting - push the local filter
			result->filters.emplace(local_id, std::move(local_filter));
		} else {
			// failed to cast - copy the global filter and evaluate the conversion expression in the reader
			result->filters.emplace(local_id, global_filter.Copy());

			// add the expression to the expression map - we are now evaluating this inside the reader directly
			// we need to set the index of the references inside the expression to 0
			SetIndexToZero(*reader_data.expressions[local_id]);
			reader.expression_map[filter_idx] = std::move(reader_data.expressions[local_id]);

			// reset the expression - since we are evaluating it in the reader we can just reference it
			reader_data.expressions[local_id] = make_uniq<BoundReferenceExpression>(global_type, local_id);
		}
	}
	return result;
}